

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_test_add.cpp
# Opt level: O3

void add_test(void)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Addition tests completed",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void add_test()
{
	try
	{
		add_test_uint64_uint64();
		add_test_uint64_uint32();
		add_test_uint64_int64();
		add_test_uint64_int32();

		add_test_int64_uint64();
		add_test_int64_uint32();
		add_test_int64_int64();
		add_test_int64_int32();

		add_test_uint32_uint64();
		add_test_uint32_uint32();
		add_test_uint32_int64();
		add_test_uint32_int32();

		add_test_int32_uint64();
		add_test_int32_uint32();
		add_test_int32_int64();
		add_test_int32_int32();

		std::cout << "Addition tests completed" << std::endl;
	}
	catch (std::exception& err)
	{
		std::cout << "Addition tests failed - " << err.what() << std::endl;
	}

	return;
}